

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.h
# Opt level: O3

void __thiscall
HighsGFkSolve::fromCSC<3u,1,long>
          (HighsGFkSolve *this,vector<long,_std::allocator<long>_> *Aval,
          vector<int,_std::allocator<int>_> *Aindex,vector<int,_std::allocator<int>_> *Astart,
          HighsInt numRow)

{
  pointer puVar1;
  iterator __position;
  iterator iVar2;
  int iVar3;
  pointer piVar4;
  value_type_conflict3 vVar5;
  long lVar6;
  int *__args;
  char *extraout_RDX;
  char *__to;
  char *extraout_RDX_00;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  size_type sVar12;
  value_type_conflict3 local_58;
  uint local_54;
  vector<int,std::allocator<int>> *local_50;
  vector<int,std::allocator<int>> *local_48;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  
  puVar1 = (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  piVar4 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  piVar4 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar4) {
    (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar4;
  }
  local_40 = &this->Avalue;
  local_48 = (vector<int,std::allocator<int>> *)&this->Acol;
  local_50 = (vector<int,std::allocator<int>> *)&this->Arow;
  piVar4 = (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38 = Aindex;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4);
  }
  iVar3 = (int)((ulong)((long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2) + -1;
  this->numCol = iVar3;
  this->numRow = numRow;
  local_58 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->colhead,(long)iVar3,(value_type_conflict2 *)&local_58);
  uVar10 = 0;
  local_58 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->colsize,(long)this->numCol,(value_type_conflict2 *)&local_58);
  sVar12 = (size_type)numRow;
  local_58 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign
            (&this->rhs,sVar12,&local_58);
  local_58 = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->rowroot,sVar12,(value_type_conflict2 *)&local_58);
  local_58 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->rowsize,sVar12,(value_type_conflict2 *)&local_58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (local_40,(long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_48,
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_50,
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  local_58 = 0;
  vVar5 = this->numCol;
  if (vVar5 != 0) {
    piVar4 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      iVar9 = (int)uVar10;
      iVar3 = piVar4[iVar9];
      if (iVar3 == piVar4[(long)iVar9 + 1]) {
        uVar10 = (ulong)(iVar9 + 1);
      }
      else {
        lVar8 = (long)iVar3 << 2;
        do {
          lVar6 = *(long *)((long)(Aval->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar8 * 2) % 3;
          if (lVar6 != 0) {
            local_54 = (uint)lVar6 + 3;
            if (-1 < lVar6) {
              local_54 = (uint)lVar6;
            }
            __position._M_current =
                 (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>(local_40,__position,&local_54);
            }
            else {
              *__position._M_current = local_54;
              (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            iVar2._M_current =
                 (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_48,iVar2,(int *)&local_58);
            }
            else {
              *iVar2._M_current = local_58;
              (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
            __args = (int *)((long)(local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                   .super__Vector_impl_data._M_start + lVar8);
            iVar2._M_current =
                 (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_50,iVar2,__args);
            }
            else {
              *iVar2._M_current = *__args;
              (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            }
          }
          piVar4 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar8 = lVar8 + 4;
          iVar3 = iVar3 + 1;
        } while (iVar3 != piVar4[(long)(int)local_58 + 1]);
        uVar10 = (long)(int)local_58 + 1;
        vVar5 = this->numCol;
      }
      local_58 = (value_type_conflict3)uVar10;
    } while (local_58 != vVar5);
  }
  uVar11 = (uint)((ulong)((long)(this->Avalue).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->Avalue).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  sVar12 = (size_type)(int)uVar11;
  std::vector<int,_std::allocator<int>_>::resize(&this->Anext,sVar12);
  std::vector<int,_std::allocator<int>_>::resize(&this->Aprev,sVar12);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARleft,sVar12);
  std::vector<int,_std::allocator<int>_>::resize(&this->ARright,sVar12);
  if (uVar11 != 0) {
    uVar7 = 0;
    __to = extraout_RDX;
    do {
      link(this,(char *)(ulong)uVar7,__to);
      uVar7 = uVar7 + 1;
      __to = extraout_RDX_00;
    } while (uVar11 != uVar7);
  }
  return;
}

Assistant:

void fromCSC(const std::vector<T>& Aval, const std::vector<HighsInt>& Aindex,
               const std::vector<HighsInt>& Astart, HighsInt numRow) {
    Avalue.clear();
    Acol.clear();
    Arow.clear();

    freeslots = decltype(freeslots)();

    numCol = Astart.size() - 1;
    this->numRow = numRow;

    colhead.assign(numCol, -1);
    colsize.assign(numCol, 0);

    rhs.assign(kNumRhs * numRow, 0);
    rowroot.assign(numRow, -1);
    rowsize.assign(numRow, 0);

    Avalue.reserve(Aval.size());
    Acol.reserve(Aval.size());
    Arow.reserve(Aval.size());

    for (HighsInt i = 0; i != numCol; ++i) {
      for (HighsInt j = Astart[i]; j != Astart[i + 1]; ++j) {
        assert(Aval[j] == (int64_t)Aval[j]);
        int64_t val = ((int64_t)Aval[j]) % k;
        if (val == 0) continue;

        if (val < 0) val += k;
        assert(val >= 0);

        Avalue.push_back(val);
        Acol.push_back(i);
        Arow.push_back(Aindex[j]);
      }
    }

    HighsInt nnz = Avalue.size();
    Anext.resize(nnz);
    Aprev.resize(nnz);
    ARleft.resize(nnz);
    ARright.resize(nnz);
    for (HighsInt pos = 0; pos != nnz; ++pos) link(pos);
  }